

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.cpp
# Opt level: O3

void calc0<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
               (options2 *opt)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  invalid_argument *this;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_RCX;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *in_R8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  r_2;
  real_t Jy;
  real_t Jx;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  f;
  multiply_immediates local_3b9;
  cpp_dec_float<50U,_int,_void> local_3b8;
  cpp_dec_float<50U,_int,_void> local_378;
  cpp_dec_float<50U,_int,_void> local_338;
  expression<boost::multiprecision::detail::add_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
  local_2f8;
  cpp_dec_float<50U,_int,_void> local_2e8;
  cpp_dec_float<50U,_int,_void> local_2a8;
  cpp_dec_float<50U,_int,_void> local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_228;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_1e8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_1a8;
  square local_168 [8];
  uint auStack_160 [2];
  uint local_158 [2];
  undefined8 uStack_150;
  undefined8 local_148;
  int local_140;
  undefined1 local_13c;
  fpclass_type local_138;
  int32_t iStack_134;
  cpp_dec_float<50U,_int,_void> local_128;
  cpp_dec_float<50U,_int,_void> local_e8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_a8;
  tc local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  local_268.fpclass = cpp_dec_float_finite;
  local_268.prec_elem = 10;
  local_268.data._M_elems[0] = 0;
  local_268.data._M_elems[1] = 0;
  local_268.data._M_elems[2] = 0;
  local_268.data._M_elems[3] = 0;
  local_268.data._M_elems[4] = 0;
  local_268.data._M_elems[5] = 0;
  local_268.data._M_elems._24_5_ = 0;
  local_268.data._M_elems[7]._1_3_ = 0;
  local_268.data._M_elems._32_5_ = 0;
  local_268.data._M_elems[9]._1_3_ = 0;
  local_268.exp = 0;
  local_268.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::rd_string
            (&local_268,(opt->Jx)._M_dataplus._M_p);
  local_2a8.fpclass = cpp_dec_float_finite;
  local_2a8.prec_elem = 10;
  local_2a8.data._M_elems[0] = 0;
  local_2a8.data._M_elems[1] = 0;
  local_2a8.data._M_elems[2] = 0;
  local_2a8.data._M_elems[3] = 0;
  local_2a8.data._M_elems[4] = 0;
  local_2a8.data._M_elems[5] = 0;
  local_2a8.data._M_elems._24_5_ = 0;
  local_2a8.data._M_elems[7]._1_3_ = 0;
  local_2a8.data._M_elems._32_5_ = 0;
  local_2a8.data._M_elems[9]._1_3_ = 0;
  local_2a8.exp = 0;
  local_2a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::rd_string
            (&local_2a8,(opt->Jy)._M_dataplus._M_p);
  local_378.data._M_elems._32_5_ = 0;
  local_378.data._M_elems[9]._1_3_ = 0;
  local_378.exp = 0;
  local_378.neg = false;
  local_378.data._M_elems[4] = 0;
  local_378.data._M_elems[5] = 0;
  local_378.data._M_elems._24_5_ = 0;
  local_378.data._M_elems[7]._1_3_ = 0;
  local_378.data._M_elems[0] = 0;
  local_378.data._M_elems[1] = 0;
  local_378.data._M_elems[2] = 0;
  local_378.data._M_elems[3] = 0;
  local_338.data._M_elems._32_5_ = 0;
  local_338.data._M_elems[9]._1_3_ = 0;
  local_338.exp = 0;
  local_338.neg = false;
  local_338.data._M_elems[4] = 0;
  local_338.data._M_elems[5] = 0;
  local_338.data._M_elems._24_5_ = 0;
  local_338.data._M_elems[7]._1_3_ = 0;
  local_338.data._M_elems[0] = 0;
  local_338.data._M_elems[1] = 0;
  local_338.data._M_elems[2] = 0;
  local_338.data._M_elems[3] = 0;
  local_2e8.data._M_elems._32_5_ = 0;
  local_2e8.data._M_elems[9]._1_3_ = 0;
  local_2e8.exp = 0;
  local_2e8.neg = false;
  local_2e8.data._M_elems[4] = 0;
  local_2e8.data._M_elems[5] = 0;
  local_2e8.data._M_elems._24_5_ = 0;
  local_2e8.data._M_elems[7]._1_3_ = 0;
  local_2e8.data._M_elems[0] = 0;
  local_2e8.data._M_elems[1] = 0;
  local_2e8.data._M_elems[2] = 0;
  local_2e8.data._M_elems[3] = 0;
  iVar3 = std::__cxx11::string::compare((char *)&opt->Tmin);
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&opt->Tmin), iVar3 == 0)) {
    uStack_50 = CONCAT35(local_268.data._M_elems[7]._1_3_,local_268.data._M_elems._24_5_);
    local_68 = (tc  [8])local_268.data._M_elems._0_8_;
    auStack_60[0] = local_268.data._M_elems[2];
    auStack_60[1] = local_268.data._M_elems[3];
    local_58[0] = local_268.data._M_elems[4];
    local_58[1] = local_268.data._M_elems[5];
    local_48 = CONCAT35(local_268.data._M_elems[9]._1_3_,local_268.data._M_elems._32_5_);
    local_40 = local_268.exp;
    local_3c = local_268.neg;
    local_38 = local_268.fpclass;
    iStack_34 = local_268.prec_elem;
    local_a8.base.m_backend.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
    local_a8.base.m_backend.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
    local_a8.base.m_backend.data._M_elems[0] = local_2a8.data._M_elems[0];
    local_a8.base.m_backend.data._M_elems[1] = local_2a8.data._M_elems[1];
    local_a8.base.m_backend.data._M_elems[2] = local_2a8.data._M_elems[2];
    local_a8.base.m_backend.data._M_elems[3] = local_2a8.data._M_elems[3];
    local_a8.base.m_backend.data._M_elems[4] = local_2a8.data._M_elems[4];
    local_a8.base.m_backend.data._M_elems[5] = local_2a8.data._M_elems[5];
    local_a8.base.m_backend.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
    local_a8.base.m_backend.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
    local_a8.base.m_backend.exp = local_2a8.exp;
    local_a8.base.m_backend.neg = local_2a8.neg;
    local_a8.base.m_backend.fpclass = local_2a8.fpclass;
    local_a8.base.m_backend.prec_elem = local_2a8.prec_elem;
    ising::tc::
    square<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_3b8,local_68,&local_a8,in_RCX);
    local_338.data._M_elems[0] = local_3b8.data._M_elems[0];
    local_338.data._M_elems[1] = local_3b8.data._M_elems[1];
    local_338.data._M_elems[2] = local_3b8.data._M_elems[2];
    local_338.data._M_elems[3] = local_3b8.data._M_elems[3];
    local_338.data._M_elems[4] = local_3b8.data._M_elems[4];
    local_338.data._M_elems[5] = local_3b8.data._M_elems[5];
    local_338.data._M_elems._24_5_ = local_3b8.data._M_elems._24_5_;
    local_338.data._M_elems[7]._1_3_ = local_3b8.data._M_elems[7]._1_3_;
    local_338.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
    local_338.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
    local_338.exp = local_3b8.exp;
    local_338.neg = local_3b8.neg;
    local_338.fpclass = local_3b8.fpclass;
    local_338.prec_elem = local_3b8.prec_elem;
    local_378.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
    local_378.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
    local_378.data._M_elems[4] = local_3b8.data._M_elems[4];
    local_378.data._M_elems[5] = local_3b8.data._M_elems[5];
    local_378.data._M_elems._24_5_ = local_3b8.data._M_elems._24_5_;
    local_378.data._M_elems[7]._1_3_ = local_3b8.data._M_elems[7]._1_3_;
    local_378.data._M_elems[0] = local_3b8.data._M_elems[0];
    local_378.data._M_elems[1] = local_3b8.data._M_elems[1];
    local_378.data._M_elems[2] = local_3b8.data._M_elems[2];
    local_378.data._M_elems[3] = local_3b8.data._M_elems[3];
    local_378.exp = local_3b8.exp;
    local_378.neg = local_3b8.neg;
    local_378.fpclass = local_3b8.fpclass;
    local_378.prec_elem = local_3b8.prec_elem;
  }
  else {
    local_3b8.fpclass = cpp_dec_float_finite;
    local_3b8.prec_elem = 10;
    local_3b8.data._M_elems[0] = 0;
    local_3b8.data._M_elems[1] = 0;
    local_3b8.data._M_elems[2] = 0;
    local_3b8.data._M_elems[3] = 0;
    local_3b8.data._M_elems[4] = 0;
    local_3b8.data._M_elems[5] = 0;
    local_3b8.data._M_elems._24_5_ = 0;
    local_3b8.data._M_elems[7]._1_3_ = 0;
    local_3b8.data._M_elems._32_5_ = 0;
    local_3b8.data._M_elems[9]._1_3_ = 0;
    local_3b8.exp = 0;
    local_3b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::rd_string
              (&local_3b8,(opt->Tmin)._M_dataplus._M_p);
    local_378.data._M_elems[0] = local_3b8.data._M_elems[0];
    local_378.data._M_elems[1] = local_3b8.data._M_elems[1];
    local_378.data._M_elems[2] = local_3b8.data._M_elems[2];
    local_378.data._M_elems[3] = local_3b8.data._M_elems[3];
    local_378.data._M_elems[4] = local_3b8.data._M_elems[4];
    local_378.data._M_elems[5] = local_3b8.data._M_elems[5];
    local_378.data._M_elems._24_5_ = local_3b8.data._M_elems._24_5_;
    local_378.data._M_elems[7]._1_3_ = local_3b8.data._M_elems[7]._1_3_;
    local_378.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
    local_378.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
    local_378.exp = local_3b8.exp;
    local_378.neg = local_3b8.neg;
    local_378.fpclass = local_3b8.fpclass;
    local_378.prec_elem = local_3b8.prec_elem;
    local_3b8.fpclass = cpp_dec_float_finite;
    local_3b8.prec_elem = 10;
    local_3b8.data._M_elems[0] = 0;
    local_3b8.data._M_elems[1] = 0;
    local_3b8.data._M_elems[2] = 0;
    local_3b8.data._M_elems[3] = 0;
    local_3b8.data._M_elems[4] = 0;
    local_3b8.data._M_elems[5] = 0;
    local_3b8.data._M_elems._24_5_ = 0;
    local_3b8.data._M_elems[7]._1_3_ = 0;
    local_3b8.data._M_elems._32_5_ = 0;
    local_3b8.data._M_elems[9]._1_3_ = 0;
    local_3b8.exp = 0;
    local_3b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::rd_string
              (&local_3b8,(opt->Tmax)._M_dataplus._M_p);
    local_338.data._M_elems[0] = local_3b8.data._M_elems[0];
    local_338.data._M_elems[1] = local_3b8.data._M_elems[1];
    local_338.data._M_elems[2] = local_3b8.data._M_elems[2];
    local_338.data._M_elems[3] = local_3b8.data._M_elems[3];
    local_338.data._M_elems[4] = local_3b8.data._M_elems[4];
    local_338.data._M_elems[5] = local_3b8.data._M_elems[5];
    local_338.data._M_elems._24_5_ = local_3b8.data._M_elems._24_5_;
    local_338.data._M_elems[7]._1_3_ = local_3b8.data._M_elems[7]._1_3_;
    local_338.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
    local_338.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
    local_338.exp = local_3b8.exp;
    local_338.neg = local_3b8.neg;
    local_338.fpclass = local_3b8.fpclass;
    local_338.prec_elem = local_3b8.prec_elem;
    local_3b8.fpclass = cpp_dec_float_finite;
    local_3b8.prec_elem = 10;
    local_3b8.data._M_elems[0] = 0;
    local_3b8.data._M_elems[1] = 0;
    local_3b8.data._M_elems[2] = 0;
    local_3b8.data._M_elems[3] = 0;
    local_3b8.data._M_elems[4] = 0;
    local_3b8.data._M_elems[5] = 0;
    local_3b8.data._M_elems._24_5_ = 0;
    local_3b8.data._M_elems[7]._1_3_ = 0;
    local_3b8.data._M_elems._32_5_ = 0;
    local_3b8.data._M_elems[9]._1_3_ = 0;
    local_3b8.exp = 0;
    local_3b8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::rd_string
              (&local_3b8,(opt->dT)._M_dataplus._M_p);
  }
  local_2e8.data._M_elems._0_8_ = local_3b8.data._M_elems._0_8_;
  local_3b8.data._M_elems._0_8_ = local_3b8.data._M_elems._0_8_ & 0xffffffff00000000;
  local_2e8.data._M_elems._8_8_ = local_3b8.data._M_elems._8_8_;
  local_2e8.data._M_elems._16_8_ = local_3b8.data._M_elems._16_8_;
  local_2e8.data._M_elems._24_5_ = local_3b8.data._M_elems._24_5_;
  local_2e8.data._M_elems[7]._1_3_ = local_3b8.data._M_elems[7]._1_3_;
  local_2e8.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
  local_2e8.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
  local_2e8.exp = local_3b8.exp;
  local_2e8.neg = local_3b8.neg;
  local_2e8._48_8_ = local_3b8._48_8_;
  bVar2 = operator<((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                     *)&local_378,(int *)&local_3b8);
  if (!bVar2) {
    local_e8.data._M_elems._0_8_ = local_e8.data._M_elems._0_8_ & 0xffffffff00000000;
    bVar2 = operator<((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_338,(int *)&local_e8);
    if (!bVar2) {
      if (((local_378.fpclass == cpp_dec_float_NaN) || (local_338.fpclass == cpp_dec_float_NaN)) ||
         (iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_378,&local_338), iVar3 < 1)) {
        local_3b8.data._M_elems._0_8_ = local_3b8.data._M_elems._0_8_ & 0xffffffff00000000;
        bVar2 = operator<=((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                            *)&local_2e8,(int *)&local_3b8);
        lVar1 = std::cout;
        if (!bVar2) {
          *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xfffffefb |
               0x100;
          *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) =
               0x32;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# lattice: square\n",0x12);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"# precision: ",0xd);
          plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x32);
          std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
          std::ostream::put((char)plVar4);
          poVar5 = (ostream *)std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"# Lx Ly Jx Jy T 1/T F/N E/N C/N\n",0x20);
          local_e8.data._M_elems[9]._1_3_ = local_378.data._M_elems[9]._1_3_;
          local_e8.data._M_elems._32_5_ = local_378.data._M_elems._32_5_;
          local_e8.data._M_elems[7]._1_3_ = local_378.data._M_elems[7]._1_3_;
          local_e8.data._M_elems._24_5_ = local_378.data._M_elems._24_5_;
          local_e8.data._M_elems[4] = local_378.data._M_elems[4];
          local_e8.data._M_elems[5] = local_378.data._M_elems[5];
          local_e8.data._M_elems[0] = local_378.data._M_elems[0];
          local_e8.data._M_elems[1] = local_378.data._M_elems[1];
          local_e8.data._M_elems[2] = local_378.data._M_elems[2];
          local_e8.data._M_elems[3] = local_378.data._M_elems[3];
          local_e8.exp = local_378.exp;
          local_e8.neg = local_378.neg;
          local_e8.fpclass = local_378.fpclass;
          local_e8.prec_elem = local_378.prec_elem;
          while( true ) {
            local_2f8.arg1 = (type)0x3f1a36e2eb1c432d;
            local_3b8.fpclass = cpp_dec_float_finite;
            local_3b8.prec_elem = 10;
            local_3b8.data._M_elems[0] = 0;
            local_3b8.data._M_elems[1] = 0;
            local_3b8.data._M_elems[2] = 0;
            local_3b8.data._M_elems[3] = 0;
            local_3b8.data._M_elems[4] = 0;
            local_3b8.data._M_elems[5] = 0;
            local_3b8.data._M_elems._24_5_ = 0;
            local_3b8.data._M_elems[7]._1_3_ = 0;
            local_3b8.data._M_elems._32_5_ = 0;
            local_3b8.data._M_elems[9]._1_3_ = 0;
            local_3b8.exp = 0;
            local_3b8.neg = false;
            local_2f8.arg2 = (type)&local_2e8;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::multiply_immediates,double,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_3b8,
                       (expression<boost::multiprecision::detail::multiply_immediates,_double,_boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                        *)&local_2f8,&local_3b9);
            local_228.m_backend.data._M_elems[7]._1_3_ = local_3b8.data._M_elems[7]._1_3_;
            local_228.m_backend.data._M_elems._24_5_ = local_3b8.data._M_elems._24_5_;
            local_228.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
            local_228.m_backend.data._M_elems[1] = local_3b8.data._M_elems[1];
            local_228.m_backend.data._M_elems[2] = local_3b8.data._M_elems[2];
            local_228.m_backend.data._M_elems[3] = local_3b8.data._M_elems[3];
            local_228.m_backend.data._M_elems[4] = local_3b8.data._M_elems[4];
            local_228.m_backend.data._M_elems[5] = local_3b8.data._M_elems[5];
            local_228.m_backend.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
            local_228.m_backend.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
            local_228.m_backend.exp = local_3b8.exp;
            local_228.m_backend.neg = local_3b8.neg;
            local_228.m_backend.fpclass = local_3b8.fpclass;
            local_228.m_backend.prec_elem = local_3b8.prec_elem;
            local_2f8.arg1 = (type)&local_338;
            local_3b8.fpclass = cpp_dec_float_finite;
            local_3b8.prec_elem = 10;
            local_3b8.data._M_elems[0] = 0;
            local_3b8.data._M_elems[1] = 0;
            local_3b8.data._M_elems[2] = 0;
            local_3b8.data._M_elems[3] = 0;
            local_3b8.data._M_elems[4] = 0;
            local_3b8.data._M_elems[5] = 0;
            local_3b8.data._M_elems._24_5_ = 0;
            local_3b8.data._M_elems[7]._1_3_ = 0;
            local_3b8.data._M_elems._32_5_ = 0;
            local_3b8.data._M_elems[9]._1_3_ = 0;
            local_3b8.exp = 0;
            local_3b8.neg = false;
            local_2f8.arg2 = &local_228;
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
            ::
            do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::add_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>,void,void>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>
                        *)&local_3b8,&local_2f8,(add_immediates *)&local_3b9);
            local_128.data._M_elems[7]._1_3_ = local_3b8.data._M_elems[7]._1_3_;
            local_128.data._M_elems._24_5_ = local_3b8.data._M_elems._24_5_;
            local_128.data._M_elems[0] = local_3b8.data._M_elems[0];
            local_128.data._M_elems[1] = local_3b8.data._M_elems[1];
            local_128.data._M_elems[2] = local_3b8.data._M_elems[2];
            local_128.data._M_elems[3] = local_3b8.data._M_elems[3];
            local_128.data._M_elems[4] = local_3b8.data._M_elems[4];
            local_128.data._M_elems[5] = local_3b8.data._M_elems[5];
            local_128.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
            local_128.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
            local_128.exp = local_3b8.exp;
            local_128.neg = local_3b8.neg;
            local_128.fpclass = local_3b8.fpclass;
            local_128.prec_elem = local_3b8.prec_elem;
            if ((local_e8.fpclass == cpp_dec_float_NaN) || (local_3b8.fpclass == cpp_dec_float_NaN))
            break;
            iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_e8,&local_128);
            if (-1 < iVar3) {
              return;
            }
            operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_3b8,1,
                      (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_e8);
            uStack_150 = CONCAT35(local_268.data._M_elems[7]._1_3_,local_268.data._M_elems._24_5_);
            local_168 = (square  [8])local_268.data._M_elems._0_8_;
            auStack_160[0] = local_268.data._M_elems[2];
            auStack_160[1] = local_268.data._M_elems[3];
            local_158[0] = local_268.data._M_elems[4];
            local_158[1] = local_268.data._M_elems[5];
            local_148 = CONCAT35(local_268.data._M_elems[9]._1_3_,local_268.data._M_elems._32_5_);
            local_140 = local_268.exp;
            local_13c = local_268.neg;
            local_138 = local_268.fpclass;
            iStack_134 = local_268.prec_elem;
            local_1a8.base.m_backend.data._M_elems[7]._1_3_ = local_2a8.data._M_elems[7]._1_3_;
            local_1a8.base.m_backend.data._M_elems._24_5_ = local_2a8.data._M_elems._24_5_;
            local_1a8.base.m_backend.data._M_elems[0] = local_2a8.data._M_elems[0];
            local_1a8.base.m_backend.data._M_elems[1] = local_2a8.data._M_elems[1];
            local_1a8.base.m_backend.data._M_elems[2] = local_2a8.data._M_elems[2];
            local_1a8.base.m_backend.data._M_elems[3] = local_2a8.data._M_elems[3];
            local_1a8.base.m_backend.data._M_elems[4] = local_2a8.data._M_elems[4];
            local_1a8.base.m_backend.data._M_elems[5] = local_2a8.data._M_elems[5];
            local_1a8.base.m_backend.data._M_elems[9]._1_3_ = local_2a8.data._M_elems[9]._1_3_;
            local_1a8.base.m_backend.data._M_elems._32_5_ = local_2a8.data._M_elems._32_5_;
            local_1a8.base.m_backend.exp = local_2a8.exp;
            local_1a8.base.m_backend.neg = local_2a8.neg;
            local_1a8.base.m_backend.fpclass = local_2a8.fpclass;
            local_1a8.base.m_backend.prec_elem = local_2a8.prec_elem;
            local_1e8.base.m_backend.data._M_elems[7]._1_3_ = local_3b8.data._M_elems[7]._1_3_;
            local_1e8.base.m_backend.data._M_elems._24_5_ = local_3b8.data._M_elems._24_5_;
            local_1e8.base.m_backend.data._M_elems[0] = local_3b8.data._M_elems[0];
            local_1e8.base.m_backend.data._M_elems[1] = local_3b8.data._M_elems[1];
            local_1e8.base.m_backend.data._M_elems[2] = local_3b8.data._M_elems[2];
            local_1e8.base.m_backend.data._M_elems[3] = local_3b8.data._M_elems[3];
            local_1e8.base.m_backend.data._M_elems[4] = local_3b8.data._M_elems[4];
            local_1e8.base.m_backend.data._M_elems[5] = local_3b8.data._M_elems[5];
            local_1e8.base.m_backend.data._M_elems[9]._1_3_ = local_3b8.data._M_elems[9]._1_3_;
            local_1e8.base.m_backend.data._M_elems._32_5_ = local_3b8.data._M_elems._32_5_;
            local_1e8.base.m_backend.exp = local_3b8.exp;
            local_1e8.base.m_backend.neg = local_3b8.neg;
            local_1e8.base.m_backend.fpclass = local_3b8.fpclass;
            local_1e8.base.m_backend.prec_elem = local_3b8.prec_elem;
            ising::free_energy::square::
            infinite<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>,mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&local_128,local_168,&local_1a8,&local_1e8,in_R8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"inf inf ",8);
            poVar5 = boost::multiprecision::operator<<
                               ((ostream *)&std::cout,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                 *)&local_268);
            local_228.m_backend.data._M_elems[0]._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_228,1)
            ;
            poVar5 = boost::multiprecision::operator<<
                               (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_2a8);
            local_228.m_backend.data._M_elems[0]._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_228,1)
            ;
            poVar5 = boost::multiprecision::operator<<
                               (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_e8);
            local_228.m_backend.data._M_elems[0]._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_228,1)
            ;
            poVar5 = boost::multiprecision::operator<<
                               (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_3b8);
            local_228.m_backend.data._M_elems[0]._0_1_ = 0x20;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)&local_228,1)
            ;
            poVar5 = boost::multiprecision::operator<<
                               (poVar5,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                                        *)&local_128);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," N/A N/A",8);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&local_e8,&local_2e8);
          }
          return;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"dT should be positive");
      }
      else {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
      }
      goto LAB_0012a094;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Temperature should be positive");
LAB_0012a094:
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc0(const options2& opt) {
  using namespace ising::free_energy;
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t beta = 1 / t;
    auto f = square::infinite(Jx, Jy, beta);
    std::cout << "inf inf " << Jx << ' ' << Jy << ' ' << t << ' ' << beta << ' '
              << f << " N/A N/A" << std::endl;
  }
}